

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall kj::ArrayBuilder<CallbackEvent>::dispose(ArrayBuilder<CallbackEvent> *this)

{
  CallbackEvent *pCVar1;
  RemoveConst<CallbackEvent> *pRVar2;
  CallbackEvent *pCVar3;
  
  pCVar1 = this->ptr;
  if (pCVar1 != (CallbackEvent *)0x0) {
    pRVar2 = this->pos;
    pCVar3 = this->endPtr;
    this->endPtr = (CallbackEvent *)0x0;
    this->ptr = (CallbackEvent *)0x0;
    this->pos = (RemoveConst<CallbackEvent> *)0x0;
    (**this->disposer->_vptr_ArrayDisposer)
              (this->disposer,pCVar1,8,(long)pRVar2 - (long)pCVar1 >> 3,
               (long)pCVar3 - (long)pCVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }